

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  int *piVar1;
  byte bVar2;
  ImGuiContext *pIVar3;
  uchar *ttf_data;
  ImFont *pIVar4;
  ushort *puVar5;
  long lVar6;
  uchar *puVar7;
  ushort *puVar8;
  uint uVar9;
  ImFontConfig *pIVar10;
  ulong uVar11;
  uint ttf_size;
  bool bVar12;
  byte bVar13;
  ImFontConfig font_cfg;
  ImFontConfig local_98;
  
  pIVar3 = GImGui;
  bVar13 = 0;
  uVar9 = *(uint *)((long)compressed_ttf_data + 8);
  ttf_size = uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18;
  piVar1 = &(GImGui->IO).MetricsAllocs;
  *piVar1 = *piVar1 + 1;
  ttf_data = (uchar *)(*(pIVar3->IO).MemAllocFn)((size_t)ttf_size);
  uVar9 = *compressed_ttf_data;
  if (((uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18) ==
       0x57bc0000) &&
     (uVar9 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar9 >> 0x18 == 0 && (uVar9 & 0xff0000) == 0) && (uVar9 & 0xff00) == 0) &&
     (uVar9 & 0xff) == 0)) {
    uVar9 = *(uint *)((long)compressed_ttf_data + 8);
    stb__barrier3 = (uchar *)((ulong)(uint)compressed_ttf_size + (long)compressed_ttf_data);
    puVar7 = ttf_data +
             (uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 | (uVar9 & 0xff00) << 8 | uVar9 << 0x18);
    puVar8 = (ushort *)((long)compressed_ttf_data + 0x10);
    stb__barrier2 = (uchar *)compressed_ttf_data;
    stb__barrier = puVar7;
    stb__barrier4 = ttf_data;
    stb__dout = ttf_data;
    do {
      bVar2 = (byte)*puVar8;
      uVar9 = (uint)bVar2;
      if (bVar2 < 0x20) {
        if (bVar2 < 0x18) {
          if (bVar2 < 0x10) {
            if (bVar2 < 8) {
              if (bVar2 == 4) {
                stb__match(stb__dout +
                           ~((ulong)*(byte *)((long)puVar8 + 3) |
                             (ulong)*(byte *)((long)puVar8 + 1) << 0x10 |
                            (ulong)(byte)puVar8[1] << 8),
                           (ushort)(puVar8[2] << 8 | puVar8[2] >> 8) + 1);
                puVar5 = puVar8 + 3;
              }
              else {
                if (uVar9 == 6) {
                  uVar11 = ~((ulong)*(byte *)((long)puVar8 + 3) |
                             (ulong)*(byte *)((long)puVar8 + 1) << 0x10 |
                            (ulong)(byte)puVar8[1] << 8);
                  uVar9 = (uint)(byte)puVar8[2];
                  goto LAB_00154922;
                }
                puVar5 = puVar8;
                if (uVar9 == 7) {
                  stb__lit((byte *)((long)puVar8 + 3),
                           (ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                   *(ushort *)((long)puVar8 + 1) >> 8) + 1);
                  puVar5 = (ushort *)
                           ((long)puVar8 +
                           (ulong)(ushort)(*(ushort *)((long)puVar8 + 1) << 8 |
                                          *(ushort *)((long)puVar8 + 1) >> 8) + 4);
                }
              }
            }
            else {
              stb__lit((uchar *)(puVar8 + 1),
                       ((uint)bVar2 * 0x100 + (uint)*(byte *)((long)puVar8 + 1)) - 0x7ff);
              puVar5 = (ushort *)
                       ((long)puVar8 + ((ulong)(ushort)(*puVar8 << 8 | *puVar8 >> 8) - 0x7fd));
            }
          }
          else {
            uVar11 = -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                              ((uint)(byte)puVar8[1] | (uint)bVar2 << 0x10)) - 0xfffff);
            uVar9 = (uint)(ushort)(*(ushort *)((long)puVar8 + 3) << 8 |
                                  *(ushort *)((long)puVar8 + 3) >> 8);
LAB_00154922:
            stb__match(stb__dout + uVar11,uVar9 + 1);
            puVar5 = (ushort *)((long)puVar8 + 5);
          }
        }
        else {
          stb__match(stb__dout +
                     -(ulong)(((uint)*(byte *)((long)puVar8 + 1) * 0x100 +
                              ((uint)(byte)puVar8[1] | (uint)bVar2 << 0x10)) - 0x17ffff),
                     *(byte *)((long)puVar8 + 3) + 1);
          puVar5 = puVar8 + 2;
        }
      }
      else if ((char)bVar2 < '\0') {
        stb__match(stb__dout + ~(ulong)*(byte *)((long)puVar8 + 1),uVar9 - 0x7f);
        puVar5 = puVar8 + 1;
      }
      else if (bVar2 < 0x40) {
        stb__lit((byte *)((long)puVar8 + 1),uVar9 - 0x1f);
        puVar5 = (ushort *)((long)puVar8 + ((ulong)(byte)*puVar8 - 0x1e));
      }
      else {
        stb__match(stb__dout +
                   -(ulong)(((uint)*(byte *)((long)puVar8 + 1) + (uint)bVar2 * 0x100) - 0x3fff),
                   (byte)puVar8[1] + 1);
        puVar5 = (ushort *)((long)puVar8 + 3);
      }
      if (puVar5 == puVar8) {
        if (((byte)*puVar5 != 5) || (*(byte *)((long)puVar5 + 1) != 0xfa)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                        ,0x8e8,
                        "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
        if (stb__dout != puVar7) {
          __assert_fail("stb__dout == output + olen",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                        ,0x8e2,
                        "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)"
                       );
        }
      }
      else if (puVar7 < stb__dout) {
        __assert_fail("stb__dout <= output + olen",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                      ,0x8ec,
                      "unsigned int stb_decompress(unsigned char *, unsigned char *, unsigned int)")
        ;
      }
      bVar12 = puVar5 != puVar8;
      puVar8 = puVar5;
    } while (bVar12);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_98.FontData = (void *)0x0;
    local_98.FontDataSize = 0;
    local_98.FontDataOwnedByAtlas = true;
    local_98.FontNo = 0;
    local_98.SizePixels = 0.0;
    local_98.OversampleH = 3;
    local_98.OversampleV = 1;
    local_98.PixelSnapH = false;
    local_98.GlyphExtraSpacing.x = 0.0;
    local_98.GlyphExtraSpacing.y = 0.0;
    local_98.DstFont = (ImFont *)0x0;
    local_98.GlyphRanges = (ImWchar *)0x0;
    local_98.MergeMode = false;
    local_98.MergeGlyphCenterV = false;
    local_98.Name[0] = '\0';
    local_98.Name[1] = '\0';
    local_98.Name[2] = '\0';
    local_98.Name[3] = '\0';
    local_98.Name[4] = '\0';
    local_98.Name[5] = '\0';
    local_98.Name[6] = '\0';
    local_98.Name[7] = '\0';
    local_98.Name[8] = '\0';
    local_98.Name[9] = '\0';
    local_98.Name[10] = '\0';
    local_98.Name[0xb] = '\0';
    local_98.Name[0xc] = '\0';
    local_98.Name[0xd] = '\0';
    local_98.Name[0xe] = '\0';
    local_98.Name[0xf] = '\0';
    local_98.Name[0x10] = '\0';
    local_98.Name[0x11] = '\0';
    local_98.Name[0x12] = '\0';
    local_98.Name[0x13] = '\0';
    local_98.Name[0x14] = '\0';
    local_98.Name[0x15] = '\0';
    local_98.Name[0x16] = '\0';
    local_98.Name[0x17] = '\0';
    local_98.Name[0x18] = '\0';
    local_98.Name[0x19] = '\0';
    local_98.Name[0x1a] = '\0';
    local_98.Name[0x1b] = '\0';
    local_98.Name[0x1c] = '\0';
    local_98.Name[0x1d] = '\0';
    local_98.Name[0x1e] = '\0';
    local_98.Name[0x1f] = '\0';
  }
  else {
    pIVar10 = &local_98;
    for (lVar6 = 0xd; lVar6 != 0; lVar6 = lVar6 + -1) {
      pIVar10->FontData = font_cfg_template->FontData;
      font_cfg_template = (ImFontConfig *)((long)font_cfg_template + (ulong)bVar13 * -0x10 + 8);
      pIVar10 = (ImFontConfig *)((long)pIVar10 + ((ulong)bVar13 * -2 + 1) * 8);
    }
  }
  if (local_98.FontData != (void *)0x0) {
    __assert_fail("font_cfg.FontData == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/lib/imgui_draw.cpp"
                  ,0x4d0,
                  "ImFont *ImFontAtlas::AddFontFromMemoryCompressedTTF(const void *, int, float, const ImFontConfig *, const ImWchar *)"
                 );
  }
  local_98.FontDataOwnedByAtlas = true;
  pIVar4 = AddFontFromMemoryTTF(this,ttf_data,ttf_size,size_pixels,&local_98,glyph_ranges);
  return pIVar4;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char *)ImGui::MemAlloc(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}